

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storedenum.hpp
# Opt level: O1

void __thiscall
stored_flag_reader<setup::header::flags_Enum_>::add
          (stored_flag_reader<setup::header::flags_Enum_> *this,enum_type flag)

{
  char buffer [1];
  stored_type local_19;
  
  if (this->pos == 0) {
    this->bytes = this->bytes + 1;
    std::istream::read((char *)this->stream,(long)&local_19);
    this->buffer = local_19;
  }
  if ((this->buffer >> ((uint)this->pos & 0x1f) & 1) != 0) {
    flags<setup::header::flags_Enum_,_65UL>::operator|=(&this->result,flag);
  }
  this->pos = (ulong)((int)this->pos + 1U & 7);
  return;
}

Assistant:

void add(enum_type flag) {
		
		if(pos == 0) {
			bytes++;
			buffer = util::load<stored_type>(stream);
		}
		
		if(buffer & (stored_type(1) << pos)) {
			result |= flag;
		}
		
		pos = (pos + 1) % stored_bits;
	}